

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionWorldImporter.cpp
# Opt level: O2

btCollisionShape * __thiscall
btCollisionWorldImporter::createCapsuleShapeZ
          (btCollisionWorldImporter *this,btScalar radius,btScalar height)

{
  btCollisionShape *this_00;
  btCollisionShape *local_18;
  
  this_00 = (btCollisionShape *)btCapsuleShape::operator_new(0x48);
  btCapsuleShapeZ::btCapsuleShapeZ((btCapsuleShapeZ *)this_00,radius,height);
  local_18 = this_00;
  btAlignedObjectArray<btCollisionShape_*>::push_back(&this->m_allocatedCollisionShapes,&local_18);
  return this_00;
}

Assistant:

btCollisionShape* btCollisionWorldImporter::createCapsuleShapeZ(btScalar radius, btScalar height)
{
	btCapsuleShapeZ* shape = new btCapsuleShapeZ(radius,height);
	m_allocatedCollisionShapes.push_back(shape);
	return shape;
}